

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

Vec_Int_t *
Rnm_ManRefine(Rnm_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,int fPropFanout,int fNewRefinement,
             int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime aVar5;
  Gia_Obj_t *pGVar6;
  Rnm_Obj_t *local_60;
  int RetValue;
  abctime clk2;
  abctime clk;
  Vec_Int_t *vNewPPis;
  Vec_Int_t *vGoodPPis;
  int fVerify;
  int fVerbose_local;
  int fNewRefinement_local;
  int fPropFanout_local;
  Vec_Int_t *vMap_local;
  Abc_Cex_t *pCex_local;
  Rnm_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  p->nCalls = p->nCalls + 1;
  p->pCex = pCex;
  p->vMap = vMap;
  p->fPropFanout = fPropFanout;
  p->fVerbose = fVerbose;
  Rnm_ManCollect(p);
  iVar1 = Vec_IntSize(vMap);
  iVar2 = Vec_IntSize(p->vObjs);
  p->nObjsFrame = iVar1 + 1 + iVar2;
  p->nObjs = p->nObjsFrame * (pCex->iFrame + 1);
  if (p->nObjsAlloc < p->nObjs) {
    if (p->pObjs == (Rnm_Obj_t *)0x0) {
      iVar1 = p->nObjs + 10000;
      p->nObjsAlloc = iVar1;
      local_60 = (Rnm_Obj_t *)malloc((long)iVar1 << 2);
    }
    else {
      iVar1 = p->nObjs + 10000;
      p->nObjsAlloc = iVar1;
      local_60 = (Rnm_Obj_t *)realloc(p->pObjs,(long)iVar1 << 2);
    }
    p->pObjs = local_60;
  }
  memset(p->pObjs,0,(long)p->nObjs << 2);
  aVar4 = Abc_Clock();
  vNewPPis = Vec_IntAlloc(100);
  iVar1 = Rnm_ManSensitize(p);
  if (iVar1 != 0) {
    aVar5 = Abc_Clock();
    p->timeFwd = (aVar5 - aVar4) + p->timeFwd;
    aVar4 = Abc_Clock();
    p->nVisited = 0;
    pGVar6 = Gia_ManPo(p->pGia,0);
    pGVar6 = Gia_ObjFanin0(pGVar6);
    Rnm_ManJustify_rec(p,pGVar6,pCex->iFrame,vNewPPis);
    Vec_IntUniqify(vNewPPis);
    aVar5 = Abc_Clock();
    p->timeBwd = (aVar5 - aVar4) + p->timeBwd;
  }
  aVar4 = Abc_Clock();
  Rnm_ManVerifyUsingTerSim(p->pGia,p->pCex,p->vMap,p->vObjs,vNewPPis);
  aVar5 = Abc_Clock();
  p->timeVer = (aVar5 - aVar4) + p->timeVer;
  iVar1 = Vec_IntSize(vNewPPis);
  if (0 < iVar1) {
    if (fNewRefinement == 0) {
      clk = (abctime)Rnm_ManFilterSelected(p,vNewPPis);
    }
    else {
      clk = (abctime)Rnm_ManFilterSelectedNew(p,vNewPPis);
    }
    iVar1 = Vec_IntSize((Vec_Int_t *)clk);
    if (iVar1 < 1) {
      Vec_IntFree((Vec_Int_t *)clk);
    }
    else {
      Vec_IntFree(vNewPPis);
      vNewPPis = (Vec_Int_t *)clk;
    }
  }
  Rnm_ManCleanValues(p);
  aVar4 = Abc_Clock();
  p->timeTotal = (aVar4 - aVar3) + p->timeTotal;
  iVar1 = Vec_IntSize(vNewPPis);
  p->nRefines = iVar1 + p->nRefines;
  return vNewPPis;
}

Assistant:

Vec_Int_t * Rnm_ManRefine( Rnm_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, int fPropFanout, int fNewRefinement, int fVerbose )
{
    int fVerify = 1;
    Vec_Int_t * vGoodPPis, * vNewPPis;
    abctime clk, clk2 = Abc_Clock();
    int RetValue;
    p->nCalls++;
//    Gia_ManCleanValue( p->pGia );
    // initialize
    p->pCex = pCex;
    p->vMap = vMap;
    p->fPropFanout = fPropFanout;
    p->fVerbose    = fVerbose;
    // collects used objects
    Rnm_ManCollect( p );
    // initialize datastructure
    p->nObjsFrame = 1 + Vec_IntSize(vMap) + Vec_IntSize(p->vObjs);
    p->nObjs = p->nObjsFrame * (pCex->iFrame + 1);
    if ( p->nObjs > p->nObjsAlloc )
        p->pObjs = ABC_REALLOC( Rnm_Obj_t, p->pObjs, (p->nObjsAlloc = p->nObjs + 10000) );
    memset( p->pObjs, 0, sizeof(Rnm_Obj_t) * p->nObjs );
    // propagate priorities
    clk = Abc_Clock();
    vGoodPPis = Vec_IntAlloc( 100 );
    if ( Rnm_ManSensitize( p ) ) // the CEX is not a true CEX
    {
        p->timeFwd += Abc_Clock() - clk;
        // select refinement
        clk = Abc_Clock();
        p->nVisited = 0;
        Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), pCex->iFrame, vGoodPPis );
        RetValue = Vec_IntUniqify( vGoodPPis );
//        assert( RetValue == 0 );
        p->timeBwd += Abc_Clock() - clk;
    }

    // verify (empty) refinement
    // (only works when post-processing is not applied)
    if ( fVerify )
    {
        clk = Abc_Clock();
        Rnm_ManVerifyUsingTerSim( p->pGia, p->pCex, p->vMap, p->vObjs, vGoodPPis );
        p->timeVer += Abc_Clock() - clk;
    }

    // at this point array vGoodPPis contains the set of important PPIs
    if ( Vec_IntSize(vGoodPPis) > 0 ) // spurious CEX resulting in a non-trivial refinement 
    {
        // filter selected set
        if ( !fNewRefinement )  // default 
            vNewPPis = Rnm_ManFilterSelected( p, vGoodPPis );
        else // this is enabled when &gla is called with -r (&gla -r)
            vNewPPis = Rnm_ManFilterSelectedNew( p, vGoodPPis );

        // replace the PPI array if necessary
        if ( Vec_IntSize(vNewPPis) > 0 ) // something to select, replace current refinement 
            Vec_IntFree( vGoodPPis ), vGoodPPis = vNewPPis;
        else // if there is nothing to select, do not change the current refinement array
            Vec_IntFree( vNewPPis );
    }

    // clean values
    // we cannot do this before, because we need to remember what objects
    // belong to the abstraction when we do Rnm_ManFilterSelected()
    Rnm_ManCleanValues( p );

//    Vec_IntReverseOrder( vGoodPPis );
    p->timeTotal += Abc_Clock() - clk2;
    p->nRefines += Vec_IntSize(vGoodPPis);
    return vGoodPPis;
}